

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

fdb_status sb_init(filemgr *file,sb_config sconfig,err_log_callback *log_callback)

{
  uint64_t uVar1;
  void *pvVar2;
  filemgr_magic_t fVar3;
  bid_t bVar4;
  err_log_callback *in_RDX;
  undefined1 in_SIL;
  long in_RDI;
  fdb_status fs;
  bid_t sb_bid;
  size_t i;
  err_log_callback *in_stack_00000388;
  size_t in_stack_00000390;
  filemgr *in_stack_00000398;
  superblock *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  sb_config sconfig_00;
  err_log_callback *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  fdb_status fVar6;
  ulong local_20;
  fdb_status local_4;
  
  sconfig_00.num_sb = (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  if (*(long *)(in_RDI + 0x198) == 0) {
    uVar1 = filemgr_get_pos((filemgr *)0x18792b);
    if (uVar1 == 0) {
      pvVar2 = calloc(1,200);
      *(void **)(in_RDI + 0x198) = pvVar2;
      pvVar2 = calloc(1,1);
      **(undefined8 **)(in_RDI + 0x198) = pvVar2;
      fVar3 = ver_get_latest_magic();
      *(filemgr_magic_t *)(in_RDI + 400) = fVar3;
      uVar5 = CONCAT13(in_SIL,(int3)in_stack_ffffffffffffffd0);
      _sb_init(in_stack_ffffffffffffffb8,sconfig_00);
      for (local_20 = 0; local_20 < *(byte *)**(undefined8 **)(in_RDI + 0x198);
          local_20 = local_20 + 1) {
        bVar4 = filemgr_alloc((filemgr *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                              in_stack_ffffffffffffffc8);
        if (bVar4 != local_20) {
          fVar6 = FDB_RESULT_SB_RACE_CONDITION;
          fdb_log_impl(in_RDX,2,FDB_RESULT_SB_RACE_CONDITION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                       ,"sb_init",0x6fa,"Other writer interfered during sb_write (number: %lu)",
                       local_20);
          free((void *)**(undefined8 **)(in_RDI + 0x198));
          free(*(void **)(in_RDI + 0x198));
          return fVar6;
        }
        fVar6 = sb_write(in_stack_00000398,in_stack_00000390,in_stack_00000388);
        if (fVar6 != FDB_RESULT_SUCCESS) {
          return fVar6;
        }
        in_stack_ffffffffffffffd4 = 0;
      }
      local_4 = FDB_RESULT_SUCCESS;
    }
    else {
      local_4 = FDB_RESULT_SB_INIT_FAIL;
    }
  }
  else {
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

fdb_status sb_init(struct filemgr *file, struct sb_config sconfig,
                   err_log_callback * log_callback)
{
    size_t i;
    bid_t sb_bid;
    fdb_status fs;

    // exit if superblock already exists.
    if (file->sb) {
        return FDB_RESULT_SUCCESS;
    }
    // no data should be written in the file before initialization of superblock.
    if (filemgr_get_pos(file) > 0) {
        return FDB_RESULT_SB_INIT_FAIL;
    }

    file->sb = (struct superblock*)calloc(1, sizeof(struct superblock));
    file->sb->config = (struct sb_config*)calloc(1, sizeof(struct sb_config));
    file->version = ver_get_latest_magic();
    _sb_init(file->sb, sconfig);

    // write initial superblocks
    for (i=0; i<file->sb->config->num_sb; ++i) {
        // allocate
        sb_bid = filemgr_alloc(file, log_callback);
        if (sb_bid != i) {
            // other data was written during sb_write .. error
            fs = FDB_RESULT_SB_RACE_CONDITION;
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Other writer interfered during sb_write (number: %" _F64 ")",
                    i);
            free(file->sb->config);
            free(file->sb);
            return fs;
        }

        fs = sb_write(file, i, log_callback);
        if (fs != FDB_RESULT_SUCCESS) {
            return fs;
        }
    }

    return FDB_RESULT_SUCCESS;
}